

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O0

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsGL
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  SHADER_TYPE Stages_00;
  PipelineResourceAttribsType *ResDesc_00;
  uint uVar1;
  Uint32 UVar2;
  SHADER_TYPE SVar3;
  PipelineResourceSignatureGLImpl *pPVar4;
  reference pvVar5;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *local_e0;
  SHADER_TYPE local_d4;
  PipelineResourceBinding local_d0;
  SHADER_TYPE local_ac;
  SHADER_TYPE local_a8;
  type ShaderStage;
  SHADER_TYPE Stages;
  BINDING_RANGE Range;
  PipelineResourceAttribsType *ResAttr;
  PipelineResourceDesc *ResDesc;
  RefCntAutoPtr *pRStack_88;
  Uint32 r;
  value_type *pSignature;
  Uint32 s;
  TBindings BaseBindings;
  Uint32 local_64;
  undefined1 local_60 [4];
  Uint32 SignaturesCount;
  SignatureArray<PipelineResourceSignatureGLImpl> Signatures;
  SHADER_TYPE SupportedStagesMask;
  SHADER_TYPE ShaderStages;
  vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
  *ResourceBindings_local;
  PipelineResourceBindingAttribs *Info_local;
  
  if (Info->ShaderStages == SHADER_TYPE_UNKNOWN) {
    local_d4 = ~SHADER_TYPE_UNKNOWN;
  }
  else {
    local_d4 = Info->ShaderStages;
  }
  Signatures._M_elems[7].m_pObject._4_4_ = local_d4;
  Signatures._M_elems[7].m_pObject._0_4_ = 0x3f;
  memset(local_60,0,0x40);
  local_e0 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)local_60;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::RefCntAutoPtr(local_e0);
    local_e0 = local_e0 + 1;
  } while (local_e0 != Signatures._M_elems + 7);
  local_64 = 0;
  anon_unknown_1::SortResourceSignatures<Diligent::PipelineResourceSignatureGLImpl>
            (Info->ppResourceSignatures,Info->ResourceSignaturesCount,
             (SignatureArray<Diligent::PipelineResourceSignatureGLImpl> *)local_60,&local_64);
  memset((void *)((long)&pSignature + 4),0,8);
  for (pSignature._0_4_ = 0; (uint)pSignature < local_64; pSignature._0_4_ = (uint)pSignature + 1) {
    pRStack_88 = (RefCntAutoPtr *)
                 std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>,_8UL>
                 ::operator[]((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>,_8UL>
                               *)local_60,(ulong)(uint)pSignature);
    pPVar4 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureGLImpl_(pRStack_88);
    if (pPVar4 != (PipelineResourceSignatureGLImpl *)0x0) {
      ResDesc._4_4_ = 0;
      while( true ) {
        uVar1 = ResDesc._4_4_;
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)pRStack_88);
        UVar2 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetTotalResourceCount
                          (&pPVar4->
                            super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>);
        if (UVar2 <= uVar1) break;
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)pRStack_88);
        ResAttr = (PipelineResourceAttribsType *)
                  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                            (&pPVar4->
                              super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                             ResDesc._4_4_);
        pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)pRStack_88);
        _Stages = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                            (&pPVar4->
                              super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                             ResDesc._4_4_);
        ShaderStage = PipelineResourceToBindingRange((PipelineResourceDesc *)ResAttr);
        local_a8 = Diligent::operator&(Signatures._M_elems[7].m_pObject._4_4_,
                                       SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS);
        while (local_a8 != SHADER_TYPE_UNKNOWN) {
          local_ac = ExtractLSB<Diligent::SHADER_TYPE>(&local_a8);
          SVar3 = Diligent::operator&(ResAttr[1].CacheOffset,local_ac);
          ResDesc_00 = ResAttr;
          Stages_00 = local_ac;
          if (SVar3 != SHADER_TYPE_UNKNOWN) {
            pvVar5 = std::array<unsigned_short,_4UL>::operator[]
                               ((array<unsigned_short,_4UL> *)((long)&pSignature + 4),
                                (ulong)ShaderStage);
            ResDescToPipelineResBinding
                      (&local_d0,(PipelineResourceDesc *)ResDesc_00,Stages_00,
                       (uint)*pvVar5 + _Stages->CacheOffset,0);
            std::
            vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
            ::push_back(ResourceBindings,&local_d0);
          }
        }
        ResDesc._4_4_ = ResDesc._4_4_ + 1;
      }
      pPVar4 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->
                         ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)pRStack_88);
      PipelineResourceSignatureGLImpl::ShiftBindings(pPVar4,(TBindings *)((long)&pSignature + 4));
    }
  }
  std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>,_8UL>::~array
            ((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>,_8UL> *)
             local_60);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsGL(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto            ShaderStages        = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);
    constexpr SHADER_TYPE SupportedStagesMask = (SHADER_TYPE_ALL_GRAPHICS | SHADER_TYPE_COMPUTE);

    SignatureArray<PipelineResourceSignatureGLImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    PipelineResourceSignatureGLImpl::TBindings BaseBindings = {};
    for (Uint32 s = 0; s < SignaturesCount; ++s)
    {
        const auto& pSignature = Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            const auto  Range   = PipelineResourceToBindingRange(ResDesc);

            for (auto Stages = ShaderStages & SupportedStagesMask; Stages != 0;)
            {
                const auto ShaderStage = ExtractLSB(Stages);
                if ((ResDesc.ShaderStages & ShaderStage) == 0)
                    continue;

                ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ShaderStage, BaseBindings[Range] + ResAttr.CacheOffset, 0 /*space*/));
            }
        }
        pSignature->ShiftBindings(BaseBindings);
    }
}